

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Pkcs7.cpp
# Opt level: O1

size_t __thiscall axl::cry::Pkcs7::savePem(Pkcs7 *this,String *string)

{
  int iVar1;
  BIO_METHOD *method;
  BUF_MEM *pBVar2;
  undefined4 extraout_var;
  Bio bio;
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> local_18;
  
  local_18.m_h = (bio_st *)0x0;
  method = BIO_s_mem();
  Bio::create((Bio *)&local_18,(BIO_METHOD *)method);
  PEM_write_bio_PKCS7((BIO *)local_18.m_h,
                      (PKCS7 *)(this->
                               super_Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>
                               ).m_h);
  pBVar2 = Bio::getBufMem((Bio *)&local_18);
  iVar1 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                    (string,(EVP_PKEY_CTX *)pBVar2->data,(EVP_PKEY_CTX *)pBVar2->length);
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle(&local_18);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t
Pkcs7::savePem(sl::String* string) const {
	ASSERT(m_h);

	Bio bio;
	bio.createMem();
	PEM_write_bio_PKCS7(bio, m_h);

	BUF_MEM* mem = bio.getBufMem();
	return string->copy(mem->data, mem->length);
}